

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O0

VmValue * CompileVmFunctionDefinition
                    (ExpressionContext *ctx,VmModule *module,ExprFunctionDefinition *node)

{
  VmFunction *user;
  VmModule *module_00;
  SynIdentifier *pSVar1;
  VmBlock *source;
  int iVar2;
  VmConstant *pVVar3;
  VmValue *value_00;
  VmType type;
  VmType VVar4;
  VmValue *in_stack_fffffffffffffee8;
  VmValue *in_stack_fffffffffffffef0;
  ExprBase *local_b8;
  ExprBase *value;
  VmBlock *block_2;
  VmBlock *pVStack_a0;
  uint i;
  VmBlock *block_1;
  TypeBase *pTStack_90;
  VmInstruction *local_88;
  VmInstruction *inst;
  VmValue *state;
  VmBlock *block;
  VmBlock *currentBlock;
  VmFunction *currentFunction;
  TraceScope traceScope;
  SynBase *local_40;
  TypeBase *local_38;
  VmFunction *function;
  ExprFunctionDefinition *node_local;
  VmModule *module_local;
  ExpressionContext *ctx_local;
  
  user = node->function->vmFunction;
  if ((module->skipFunctionDefinitions & 1U) == 0) {
    if ((node->function->isPrototype & 1U) == 0) {
      if ((CompileVmFunctionDefinition(ExpressionContext&,VmModule*,ExprFunctionDefinition*)::token
           == '\0') &&
         (iVar2 = __cxa_guard_acquire(&CompileVmFunctionDefinition(ExpressionContext&,VmModule*,ExprFunctionDefinition*)
                                       ::token), iVar2 != 0)) {
        CompileVmFunctionDefinition::token =
             NULLC::TraceGetToken("InstructionTreeVm","CompileVmFunctionDefinition");
        __cxa_guard_release(&CompileVmFunctionDefinition(ExpressionContext&,VmModule*,ExprFunctionDefinition*)
                             ::token);
      }
      NULLC::TraceScope::TraceScope
                ((TraceScope *)&currentFunction,CompileVmFunctionDefinition::token);
      if ((user->function != (FunctionData *)0x0) && (user->function->name != (SynIdentifier *)0x0))
      {
        pSVar1 = user->function->name;
        NULLC::TraceLabel((pSVar1->name).begin,(pSVar1->name).end);
      }
      module->skipFunctionDefinitions = true;
      currentBlock = (VmBlock *)module->currentFunction;
      block = module->currentBlock;
      module->currentFunction = user;
      state = &anon_unknown.dwarf_aa461::CreateBlock(module,(node->super_ExprBase).source,"start")->
               super_VmValue;
      VmFunction::AddBlock(module->currentFunction,(VmBlock *)state);
      module->currentBlock = (VmBlock *)state;
      VmValue::AddUse(state,&user->super_VmValue);
      if ((node->function->coroutine & 1U) != 0) {
        inst = (VmInstruction *)CompileVm(ctx,module,node->coroutineStateRead);
        _block_1 = VmType::Void;
        VVar4 = _block_1;
        block_1 = VmType::Void._0_8_;
        source = block_1;
        pTStack_90 = VmType::Void.structType;
        type.structType = (TypeBase *)0x4c;
        type._0_8_ = pTStack_90;
        _block_1 = VVar4;
        local_88 = anon_unknown.dwarf_aa461::CreateInstruction
                             ((anon_unknown_dwarf_aa461 *)module,
                              (VmModule *)(node->super_ExprBase).source,(SynBase *)source,type,
                              (VmInstructionType)inst,(VmValue *)0x0,(VmValue *)0x0,(VmValue *)0x0,
                              in_stack_fffffffffffffef0);
        pVStack_a0 = anon_unknown.dwarf_aa461::CreateBlock
                               (module,(node->super_ExprBase).source,"co_start");
        VmInstruction::AddArgument(local_88,&pVStack_a0->super_VmValue);
        VmFunction::AddBlock(module->currentFunction,pVStack_a0);
        module->currentBlock = pVStack_a0;
        SmallArray<VmBlock_*,_4U>::push_back(&user->restoreBlocks,&stack0xffffffffffffff60);
        for (block_2._4_4_ = 0; block_2._4_4_ < node->function->yieldCount;
            block_2._4_4_ = block_2._4_4_ + 1) {
          value = (ExprBase *)
                  anon_unknown.dwarf_aa461::CreateBlock
                            (module,(node->super_ExprBase).source,"restore");
          VmInstruction::AddArgument(local_88,(VmValue *)value);
          SmallArray<VmBlock_*,_4U>::push_back(&user->restoreBlocks,(VmBlock **)&value);
        }
      }
      for (local_b8 = (node->expressions).head; local_b8 != (ExprBase *)0x0;
          local_b8 = local_b8->next) {
        CompileVm(ctx,module,local_b8);
      }
      anon_unknown.dwarf_aa461::CreateAbortNoReturn(module,(SynBase *)0x0);
      module->currentFunction = (VmFunction *)currentBlock;
      module->currentBlock = block;
      module->skipFunctionDefinitions = false;
      ctx_local = (ExpressionContext *)anon_unknown.dwarf_aa461::CreateVoid(module);
      NULLC::TraceScope::~TraceScope((TraceScope *)&currentFunction);
    }
    else {
      ctx_local = (ExpressionContext *)anon_unknown.dwarf_aa461::CreateVoid(module);
    }
  }
  else {
    module_00 = (VmModule *)(node->super_ExprBase).source;
    VVar4 = VmType::FunctionRef(&node->function->type->super_TypeBase);
    pVVar3 = CreateConstantPointer
                       (module->allocator,(node->super_ExprBase).source,0,(VariableData *)0x0,
                        ctx->typeNullPtr,false);
    local_40 = VVar4._0_8_;
    local_38 = VVar4.structType;
    VVar4.structType = (TypeBase *)pVVar3;
    VVar4._0_8_ = local_38;
    value_00 = anon_unknown.dwarf_aa461::CreateConstruct
                         ((anon_unknown_dwarf_aa461 *)module,module_00,local_40,VVar4,
                          &user->super_VmValue,(VmValue *)0x0,(VmValue *)0x0,
                          in_stack_fffffffffffffee8);
    ctx_local = (ExpressionContext *)
                anon_unknown.dwarf_aa461::CheckType(ctx,&node->super_ExprBase,value_00);
  }
  return (VmValue *)ctx_local;
}

Assistant:

VmValue* CompileVmFunctionDefinition(ExpressionContext &ctx, VmModule *module, ExprFunctionDefinition *node)
{
	VmFunction *function = node->function->vmFunction;

	if(module->skipFunctionDefinitions)
		return CheckType(ctx, node, CreateConstruct(module, node->source, VmType::FunctionRef(node->function->type), CreateConstantPointer(module->allocator, node->source, 0, NULL, ctx.typeNullPtr, false), function, NULL, NULL));

	if(node->function->isPrototype)
		return CreateVoid(module);

	TRACE_SCOPE("InstructionTreeVm", "CompileVmFunctionDefinition");

	if(function->function && function->function->name)
		TRACE_LABEL2(function->function->name->name.begin, function->function->name->name.end);

	module->skipFunctionDefinitions = true;

	// Store state
	VmFunction *currentFunction = module->currentFunction;
	VmBlock *currentBlock = module->currentBlock;

	// Switch to new function
	module->currentFunction = function;

	VmBlock *block = CreateBlock(module, node->source, "start");

	module->currentFunction->AddBlock(block);
	module->currentBlock = block;
	block->AddUse(function);

	if(node->function->coroutine)
	{
		VmValue *state = CompileVm(ctx, module, node->coroutineStateRead);

		VmInstruction *inst = CreateInstruction(module, node->source, VmType::Void, VM_INST_UNYIELD, state, NULL, NULL, NULL);

		{
			VmBlock *block = CreateBlock(module, node->source, "co_start");

			inst->AddArgument(block);

			module->currentFunction->AddBlock(block);
			module->currentBlock = block;

			function->restoreBlocks.push_back(block);
		}

		for(unsigned i = 0; i < node->function->yieldCount; i++)
		{
			VmBlock *block = CreateBlock(module, node->source, "restore");

			inst->AddArgument(block);

			function->restoreBlocks.push_back(block);
		}
	}

	for(ExprBase *value = node->expressions.head; value; value = value->next)
		CompileVm(ctx, module, value);

	CreateAbortNoReturn(module, NULL);

	// Restore state
	module->currentFunction = currentFunction;
	module->currentBlock = currentBlock;

	module->skipFunctionDefinitions = false;

	return CreateVoid(module);
}